

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

vector<wchar_t,_std::allocator<wchar_t>_> *
make_word<wchar_t,std::vector<wchar_t,std::allocator<wchar_t>>>
          (vector<wchar_t,_std::allocator<wchar_t>_> *__return_storage_ptr__,size_t length,
          wchar_t delim)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_30;
  
  local_30._M_string_length = 1;
  local_30.field_2._M_local_buf[1] = L'\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30.field_2._M_local_buf[0] = delim;
  make_word<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_nullptr>
            (__return_storage_ptr__,&local_30,length);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT44(local_30.field_2._M_local_buf[1],local_30.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

ResultT make_word(size_t length = 8, T delim = default_delim<T>) {
	return make_word<T, ResultT>(std::basic_string<T>{ delim }, length);
}